

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlXPathContextPtr xmlXPathNewContext(xmlDocPtr doc)

{
  xmlXPathContextPtr pxVar1;
  
  pxVar1 = (xmlXPathContextPtr)(*xmlMalloc)(0x178);
  if (pxVar1 != (xmlXPathContextPtr)0x0) {
    memset(&pxVar1->nb_variables_unused,0,0x168);
    pxVar1->doc = doc;
    pxVar1->node = (xmlNodePtr)0x0;
    pxVar1->user = (void *)0x0;
    pxVar1->types = (xmlXPathTypePtr)0x0;
    pxVar1->varHash = (xmlHashTablePtr)0x0;
    pxVar1->nb_types = 0;
    pxVar1->max_types = 0;
    pxVar1->nb_axis = 0;
    pxVar1->max_axis = 0;
    pxVar1->axis = (xmlXPathAxisPtr)0x0;
    pxVar1->contextSize = 1;
    pxVar1->proximityPosition = 1;
  }
  return pxVar1;
}

Assistant:

xmlXPathContextPtr
xmlXPathNewContext(xmlDocPtr doc) {
    xmlXPathContextPtr ret;

    ret = (xmlXPathContextPtr) xmlMalloc(sizeof(xmlXPathContext));
    if (ret == NULL)
	return(NULL);
    memset(ret, 0 , sizeof(xmlXPathContext));
    ret->doc = doc;
    ret->node = NULL;

    ret->varHash = NULL;

    ret->nb_types = 0;
    ret->max_types = 0;
    ret->types = NULL;

    ret->nb_axis = 0;
    ret->max_axis = 0;
    ret->axis = NULL;

    ret->nsHash = NULL;
    ret->user = NULL;

    ret->contextSize = 1;
    ret->proximityPosition = 1;

#ifdef XP_DEFAULT_CACHE_ON
    if (xmlXPathContextSetCache(ret, 1, -1, 0) == -1) {
	xmlXPathFreeContext(ret);
	return(NULL);
    }
#endif

    return(ret);
}